

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.cpp
# Opt level: O2

void __thiscall
qclab::qgates::iSWAP<std::complex<double>_>::apply
          (iSWAP<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int iVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_24_2_357f297d f;
  _Vector_base<int,_std::allocator<int>_> local_58;
  anon_class_24_2_357f297d local_40;
  
  (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject
    [5])(&local_58,this);
  iVar1 = *local_58._M_impl.super__Vector_impl_data._M_start;
  *local_58._M_impl.super__Vector_impl_data._M_start = iVar1 + offset;
  iVar2 = local_58._M_impl.super__Vector_impl_data._M_start[1];
  local_58._M_impl.super__Vector_impl_data._M_start[1] = offset + iVar2;
  local_40.vector =
       (vector->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_40.lambda._M_value._8_8_ = *(undefined8 *)(&DAT_003fa090 + (ulong)(op == ConjTrans) * 8);
  local_40.lambda._M_value._0_8_ = 0;
  apply4bc<qclab::qgates::lambda_iSWAP<std::complex<double>>(qclab::Op,std::complex<double>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar1 + offset,offset + iVar2,&local_40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void iSWAP< T >::apply( Op op , const int nbQubits ,
                          std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_iSWAP( op , vector.data() ) ;
    apply4bc( nbQubits , qubits[0] , qubits[1] , f ) ;
  }